

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

void total_errors(int *toterr,int *totwrn)

{
  int local_24;
  int local_20;
  int iwrn;
  int ierr;
  int i;
  int *totwrn_local;
  int *toterr_local;
  
  *toterr = 0;
  *totwrn = 0;
  if (totalhdu == 0) {
    *toterr = 1;
  }
  else {
    for (iwrn = 0; iwrn < totalhdu; iwrn = iwrn + 1) {
      *toterr = hduname[iwrn]->errnum + *toterr;
      *totwrn = hduname[iwrn]->wrnno + *totwrn;
    }
    _ierr = totwrn;
    totwrn_local = toterr;
    num_err_wrn(&local_20,&local_24);
    *totwrn_local = local_20 + *totwrn_local;
    *_ierr = local_24 + *_ierr;
  }
  return;
}

Assistant:

void total_errors (int *toterr, int * totwrn)  
{    
   int i = 0;
   int ierr, iwrn;
   *toterr = 0;
   *totwrn = 0;

   if (totalhdu == 0) { /* this means the file couldn't be opened */
       *toterr = 1;
       return;
   }

   for (i = 0; i < totalhdu; i++) { 
       *toterr += hduname[i]->errnum; 
       *totwrn += hduname[i]->wrnno;
   } 
   /*check the end of file errors */
   num_err_wrn(&ierr, &iwrn); 
   *toterr +=ierr; 
   *totwrn +=iwrn; 
   return;
}